

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O0

void C_InitConback(void)

{
  bool bVar1;
  char *name;
  
  conback = FTextureManager::CheckForTexture(&TexMan,"CONBACK",8,1);
  bVar1 = FTextureID::isValid(&conback);
  if (bVar1) {
    conshade = 0;
  }
  else {
    name = FString::operator_cast_to_char_(&gameinfo.TitlePage);
    conback = FTextureManager::GetTexture(&TexMan,name,8,0);
    conshade = 0xaf000000;
  }
  conline = !bVar1;
  return;
}

Assistant:

void C_InitConback()
{
	conback = TexMan.CheckForTexture ("CONBACK", FTexture::TEX_MiscPatch);

	if (!conback.isValid())
	{
		conback = TexMan.GetTexture (gameinfo.TitlePage, FTexture::TEX_MiscPatch);
		conshade = MAKEARGB(175,0,0,0);
		conline = true;
	}
	else
	{
		conshade = 0;
		conline = false;
	}
}